

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void bench_simple_signal(void)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  long lVar5;
  socklen_t in_ECX;
  sockaddr *__addr;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint64_t end_counter;
  uint64_t benchdone;
  uint64_t i;
  uint64_t benchstart;
  uint64_t start_counter;
  function<void_(void_*,_unsigned_long)> local_30;
  ProtoSignal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_> local_10;
  Signal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_> sig_increment;
  
  std::function<void_(void_*,_unsigned_long)>::function(&local_30);
  Simple::Signal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_>::Signal
            ((Signal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_> *)&local_10
             ,&local_30);
  std::function<void_(void_*,_unsigned_long)>::~function(&local_30);
  std::function<void(void*,unsigned_long)>::function<void(*&)(void*,unsigned_long),void>
            ((function<void(void*,unsigned_long)> *)&start_counter,
             (_func_void_void_ptr_unsigned_long **)&(anonymous_namespace)::test_counter_add2);
  Simple::Lib::ProtoSignal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_>::
  connect(&local_10,(int)(function<void(void*,unsigned_long)> *)&start_counter,__addr,in_ECX);
  std::function<void_(void_*,_unsigned_long)>::~function
            ((function<void_(void_*,_unsigned_long)> *)&start_counter);
  uVar1 = TestCounter::get();
  uVar2 = timestamp_benchmark();
  for (benchdone = 0; benchdone < 999999; benchdone = benchdone + 1) {
    Simple::Lib::ProtoSignal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_>::
    emit(&local_10,(void *)0x0,1);
  }
  uVar3 = timestamp_benchmark();
  uVar4 = TestCounter::get();
  if (uVar4 - uVar1 == benchdone) {
    lVar5 = uVar3 - uVar2;
    auVar6._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = 0x45300000;
    auVar7._8_4_ = (int)(benchdone >> 0x20);
    auVar7._0_8_ = benchdone;
    auVar7._12_4_ = 0x45300000;
    printf("OK\n  Benchmark: Simple::Signal: %fns per emission (size=%u): ",
           ((auVar6._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) /
           ((auVar7._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)benchdone) - 4503599627370496.0)),8);
    Simple::Signal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_>::~Signal
              ((Signal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_> *)
               &local_10);
    return;
  }
  __assert_fail("end_counter - start_counter == i",
                "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/test.cpp"
                ,0xbf,"void bench_simple_signal()");
}

Assistant:

static void
bench_simple_signal()
{
  Simple::Signal<void (void*, uint64_t)> sig_increment;
  sig_increment.connect(test_counter_add2);
  const uint64_t start_counter = TestCounter::get();
  const uint64_t benchstart = timestamp_benchmark();
  uint64_t i;
  for (i = 0; i < 999999; i++)
    {
      sig_increment.emit (nullptr, 1);
    }
  const uint64_t benchdone = timestamp_benchmark();
  const uint64_t end_counter = TestCounter::get();
  assert (end_counter - start_counter == i);
  printf ("OK\n  Benchmark: Simple::Signal: %fns per emission (size=%u): ",
          size_t (benchdone - benchstart) * 1.0 / size_t (i),
          (unsigned int) sizeof (sig_increment));
}